

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall
Layer::set_labels(Layer *this,
                 initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *labels)

{
  size_type sVar1;
  const_iterator pbVar2;
  reference this_00;
  bool bVar3;
  uint local_24;
  const_iterator pbStack_20;
  uint i;
  const_iterator label;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *labels_local;
  Layer *this_local;
  
  pbStack_20 = std::
               initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::begin(labels);
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<Perceptron,_std::allocator<Perceptron>_>::size(&this->m_perceptrons);
    bVar3 = false;
    if (local_24 < sVar1) {
      pbVar2 = std::
               initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(labels);
      bVar3 = pbStack_20 != pbVar2;
    }
    if (!bVar3) break;
    this_00 = std::vector<Perceptron,_std::allocator<Perceptron>_>::operator[]
                        (&this->m_perceptrons,(ulong)local_24);
    Perceptron::set_label(this_00,pbStack_20);
    local_24 = local_24 + 1;
    pbStack_20 = pbStack_20 + 1;
  }
  return;
}

Assistant:

void  Layer::set_labels(const std::initializer_list<std::string>& labels){
    auto label=labels.begin();
    for(uint i=0;i<m_perceptrons.size() && label!=labels.end();++i, ++label){
        m_perceptrons[i].set_label(*label);
    }
}